

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::uses_explicit_early_fragment_test(CompilerMSL *this)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  bool local_19;
  Bitset *ep_flags;
  CompilerMSL *this_local;
  
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  bVar1 = Bitset::get(&pSVar2->flags,9);
  local_19 = true;
  if (!bVar1) {
    local_19 = Bitset::get(&pSVar2->flags,0x115e);
  }
  return local_19;
}

Assistant:

bool CompilerMSL::uses_explicit_early_fragment_test()
{
	auto &ep_flags = get_entry_point().flags;
	return ep_flags.get(ExecutionModeEarlyFragmentTests) || ep_flags.get(ExecutionModePostDepthCoverage);
}